

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::transient_rrb<int,_false,_6>_> * __thiscall
immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
          (ref<immutable::transient_rrb<int,_false,_6>_> *this,
          ref<immutable::transient_rrb<int,_false,_6>_> *r)

{
  transient_rrb<int,_false,_6> *ptVar1;
  ref<immutable::transient_rrb<int,_false,_6>_> local_10;
  
  ptVar1 = r->ptr;
  if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
    ptVar1->_ref_count = ptVar1->_ref_count + 1;
  }
  local_10 = (ref<immutable::transient_rrb<int,_false,_6>_>)this->ptr;
  this->ptr = ptVar1;
  ~ref(&local_10);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }